

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall
cmCursesMainForm::FixValue(cmCursesMainForm *this,CacheEntryType type,string *in,string *out)

{
  bool bVar1;
  char *val;
  string local_48 [32];
  string *local_28;
  string *out_local;
  string *in_local;
  cmCursesMainForm *pcStack_10;
  CacheEntryType type_local;
  cmCursesMainForm *this_local;
  
  local_28 = out;
  out_local = in;
  in_local._4_4_ = type;
  pcStack_10 = this;
  std::__cxx11::string::find_last_not_of((char *)in,0x8ffdf8);
  std::__cxx11::string::substr((ulong)local_48,(ulong)in);
  std::__cxx11::string::operator=((string *)local_28,local_48);
  std::__cxx11::string::~string(local_48);
  if ((in_local._4_4_ == PATH) || (in_local._4_4_ == FILEPATH)) {
    cmsys::SystemTools::ConvertToUnixSlashes(local_28);
  }
  if (in_local._4_4_ == BOOL) {
    val = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::IsOff(val);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_28,"OFF");
    }
    else {
      std::__cxx11::string::operator=((string *)local_28,"ON");
    }
  }
  return;
}

Assistant:

void cmCursesMainForm::FixValue(cmState::CacheEntryType type,
                                const std::string& in, std::string& out) const
{
  out = in.substr(0,in.find_last_not_of(" ")+1);
  if(type == cmState::PATH || type == cmState::FILEPATH)
    {
    cmSystemTools::ConvertToUnixSlashes(out);
    }
  if(type == cmState::BOOL)
    {
    if(cmSystemTools::IsOff(out.c_str()))
      {
      out = "OFF";
      }
    else
      {
      out = "ON";
      }
    }
}